

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_fast_usingDict
              (char *source,char *dest,int originalSize,char *dictStart,int dictSize)

{
  byte bVar1;
  U16 UVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  size_t sVar5;
  BYTE *__n;
  BYTE *__src;
  BYTE *pBVar6;
  int dictSize_local;
  char *dictStart_local;
  int originalSize_local;
  char *dest_local;
  char *source_local;
  ulong local_a8;
  size_t u;
  size_t extml;
  BYTE *extMatch;
  BYTE *dictEnd;
  BYTE *match;
  size_t offset;
  size_t ml;
  size_t ll;
  uint token;
  BYTE *prefixStart;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  long local_38;
  long local_30;
  int local_24;
  char *local_20;
  char *local_18;
  int local_c;
  
  if ((dictSize == 0) || (dictStart + dictSize == dest)) {
    local_30 = (long)dictSize;
    local_38 = 0;
    ip = (BYTE *)0x0;
    pBVar3 = (BYTE *)(dest + originalSize);
    pBVar4 = (BYTE *)(dest + -local_30);
    oend = (BYTE *)dest;
    op = (BYTE *)source;
    local_24 = originalSize;
    local_20 = dest;
    local_18 = source;
    do {
      pBVar6 = op + 1;
      bVar1 = *op;
      ml = (size_t)(bVar1 >> 4);
      op = pBVar6;
      if (ml == 0xf) {
        sVar5 = read_long_length_no_check(&op);
        ml = sVar5 + 0xf;
      }
      if ((ulong)((long)pBVar3 - (long)oend) < ml) {
        local_c = -1;
        goto LAB_004c5311;
      }
      memmove(oend,op,ml);
      oend = oend + ml;
      op = op + ml;
      if ((ulong)((long)pBVar3 - (long)oend) < 0xc) {
        if (oend == pBVar3) {
          local_c = (int)op - (int)local_18;
        }
        else {
          local_c = -1;
        }
        goto LAB_004c5311;
      }
      offset = (size_t)(bVar1 & 0xf);
      UVar2 = LZ4_readLE16(op);
      pBVar6 = (BYTE *)(ulong)UVar2;
      op = op + 2;
      if (offset == 0xf) {
        sVar5 = read_long_length_no_check(&op);
        offset = sVar5 + 0xf;
      }
      __n = (BYTE *)(offset + 4);
      if (pBVar3 + -(long)oend < __n) {
        local_c = -1;
        goto LAB_004c5311;
      }
      if (ip + ((long)oend - (long)pBVar4) < pBVar6) {
        local_c = -1;
        goto LAB_004c5311;
      }
      dictEnd = oend + -(long)pBVar6;
      offset = (size_t)__n;
      if (oend + -(long)pBVar4 < pBVar6) {
        __src = ip + (local_38 - ((long)pBVar6 - ((long)oend - (long)pBVar4)));
        pBVar6 = ip + (local_38 - (long)__src);
        if (__n < pBVar6) {
          memmove(oend,__src,(size_t)__n);
          offset = 0;
          pBVar6 = __n;
        }
        else {
          memmove(oend,__src,(size_t)pBVar6);
          offset = (long)__n - (long)pBVar6;
        }
        oend = oend + (long)pBVar6;
        dictEnd = pBVar4;
      }
      for (local_a8 = 0; local_a8 < offset; local_a8 = local_a8 + 1) {
        oend[local_a8] = dictEnd[local_a8];
      }
      oend = oend + offset;
    } while (4 < (ulong)((long)pBVar3 - (long)oend));
    local_c = -1;
LAB_004c5311:
    source_local._4_4_ = local_c;
  }
  else {
    source_local._4_4_ =
         LZ4_decompress_fast_extDict(source,dest,originalSize,dictStart,(long)dictSize);
  }
  return source_local._4_4_;
}

Assistant:

int LZ4_decompress_fast_usingDict(const char* source, char* dest, int originalSize, const char* dictStart, int dictSize)
{
    if (dictSize==0 || dictStart+dictSize == dest)
        return LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        (size_t)dictSize, NULL, 0);
    assert(dictSize >= 0);
    return LZ4_decompress_fast_extDict(source, dest, originalSize, dictStart, (size_t)dictSize);
}